

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  uint uVar2;
  ImFontAtlasCustomRect *ptr;
  int iVar3;
  ulong uVar4;
  ImFontConfig *pIVar5;
  ImFont **ppIVar6;
  long lVar7;
  ImFont *pIVar8;
  long lVar9;
  
  if (this->Locked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x6dc,"ClearInputData","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  uVar2 = (this->ConfigData).Size;
  uVar4 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    pIVar5 = (this->ConfigData).Data;
    lVar7 = 0;
    lVar9 = 0;
    do {
      if (*(long *)(pIVar5->Name + lVar7 + -0x56) != 0) {
        if ((int)uVar4 <= lVar9) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar5 = (this->ConfigData).Data;
          uVar4 = (ulong)(uint)(this->ConfigData).Size;
        }
        if (pIVar5->Name[lVar7 + -0x4a] == '\x01') {
          if ((int)uVar4 <= lVar9) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            pIVar5 = (this->ConfigData).Data;
          }
          ImGui::MemFree(*(void **)(pIVar5->Name + lVar7 + -0x56));
          uVar4 = (ulong)(this->ConfigData).Size;
          if ((long)uVar4 <= lVar9) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            uVar4 = (ulong)(uint)(this->ConfigData).Size;
          }
          pIVar5 = (this->ConfigData).Data;
          pcVar1 = pIVar5->Name + lVar7 + -0x56;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x88;
    } while (lVar9 < (int)uVar4);
  }
  iVar3 = (this->Fonts).Size;
  if (0 < iVar3) {
    ppIVar6 = (this->Fonts).Data;
    lVar7 = 0;
    do {
      pIVar5 = (this->ConfigData).Data;
      if (pIVar5 <= ppIVar6[lVar7]->ConfigData) {
        if (iVar3 <= lVar7) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          ppIVar6 = (this->Fonts).Data;
          pIVar5 = (this->ConfigData).Data;
          iVar3 = (this->Fonts).Size;
        }
        pIVar8 = ppIVar6[lVar7];
        if (pIVar8->ConfigData < pIVar5 + (this->ConfigData).Size) {
          lVar9 = (long)iVar3;
          if (lVar9 <= lVar7) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            ppIVar6 = (this->Fonts).Data;
            pIVar8 = ppIVar6[lVar7];
            iVar3 = (this->Fonts).Size;
            lVar9 = (long)iVar3;
          }
          pIVar8->ConfigData = (ImFontConfig *)0x0;
          if (lVar9 <= lVar7) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            ppIVar6 = (this->Fonts).Data;
            iVar3 = (this->Fonts).Size;
          }
          ppIVar6[lVar7]->ConfigDataCount = 0;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  pIVar5 = (this->ConfigData).Data;
  if (pIVar5 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar5);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
}